

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.hpp
# Opt level: O0

void __thiscall
ylt::metric::summary_t::summary_t
          (summary_t *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *quantiles,seconds max_age)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  undefined1 uVar1;
  __enable_if_is_duration<std::chrono::duration<long>_> refresh_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  MetricType MVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  vector<double,_std::allocator<double>_> *rate;
  summary_impl<unsigned_long,_6UL> *this_00;
  
  MVar2 = (MetricType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  std::__cxx11::string::string(in_RDX,in_RCX);
  std::__cxx11::string::string(in_RDX,in_RCX);
  static_metric::metric_t
            ((static_metric *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),MVar2,
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  *in_RDI = &PTR__summary_t_00329fe0;
  rate = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x17);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
  this_00 = (summary_impl<unsigned_long,_6UL> *)(in_RDI + 0x1a);
  refresh_time = std::chrono::
                 duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1l>>
                           ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffef8);
  detail::summary_impl<unsigned_long,_6UL>::summary_impl(this_00,rate,(seconds)refresh_time.__r);
  __last._M_current = (double *)(in_RDI + 0x17);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
  __first._M_current._7_1_ = in_stack_ffffffffffffff17;
  __first._M_current._0_7_ = in_stack_ffffffffffffff10;
  uVar1 = std::
          is_sorted<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (__first,__last);
  if (!(bool)uVar1) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8);
    __first_00._M_current._7_1_ = uVar1;
    __first_00._M_current._0_7_ = in_stack_ffffffffffffff10;
    std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first_00,__last);
  }
  return;
}

Assistant:

summary_t(std::string name, std::string help, std::vector<double> quantiles,
            std::chrono::seconds max_age = std::chrono::seconds{0})
      : static_metric(MetricType::Summary, std::move(name), std::move(help)),
        quantiles_(std::move(quantiles)),
        impl_(quantiles_,
              std::chrono::duration_cast<std::chrono::seconds>(max_age)) {
    if (!std::is_sorted(quantiles_.begin(), quantiles_.end()))
      std::sort(quantiles_.begin(), quantiles_.end());
  }